

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

char * mpp_get_platform_dev_name(MppCtxType type,MppCodingType coding,RK_U32 platform)

{
  char *local_20;
  char *dev;
  RK_U32 platform_local;
  MppCodingType coding_local;
  MppCtxType type_local;
  
  local_20 = (char *)0x0;
  if ((((platform & 0x200) == 0) || (type != MPP_CTX_DEC)) ||
     ((coding != MPP_VIDEO_CodingAVC &&
      (((coding != MPP_VIDEO_CodingHEVC && (coding != MPP_VIDEO_CodingAVS2)) &&
       (coding != MPP_VIDEO_CodingVP9)))))) {
    if ((((platform & 0x100) == 0) || (type != MPP_CTX_DEC)) || (coding != MPP_VIDEO_CodingHEVC)) {
      if ((((platform & 0x1000) == 0) || (type != MPP_CTX_DEC)) || (coding != MPP_VIDEO_CodingAVS))
      {
        if ((((platform & 0x10000) == 0) || (type != MPP_CTX_ENC)) ||
           (coding != MPP_VIDEO_CodingAVC)) {
          if ((((platform & 0x1000000) == 0) || (type != MPP_CTX_ENC)) ||
             (coding != MPP_VIDEO_CodingHEVC)) {
            if (type == MPP_CTX_ENC) {
              local_20 = _mpp_find_device(mpp_vepu_dev,2);
            }
            if (local_20 == (char *)0x0) {
              local_20 = _mpp_find_device(mpp_vpu_dev,3);
            }
          }
          else {
            local_20 = _mpp_find_device(mpp_h265e_dev,2);
          }
        }
        else {
          local_20 = _mpp_find_device(mpp_rkvenc_dev,2);
        }
      }
      else {
        local_20 = _mpp_find_device(mpp_avsd_dev,2);
      }
    }
    else {
      local_20 = _mpp_find_device(mpp_hevc_dev,3);
    }
  }
  else {
    local_20 = _mpp_find_device(mpp_rkvdec_dev,2);
  }
  return local_20;
}

Assistant:

const char *mpp_get_platform_dev_name(MppCtxType type, MppCodingType coding, RK_U32 platform)
{
    const char *dev = NULL;

    if ((platform & HAVE_RKVDEC) && (type == MPP_CTX_DEC) &&
        (coding == MPP_VIDEO_CodingAVC ||
         coding == MPP_VIDEO_CodingHEVC ||
         coding == MPP_VIDEO_CodingAVS2 ||
         coding == MPP_VIDEO_CodingVP9)) {
        dev = mpp_find_device(mpp_rkvdec_dev);
    } else if ((platform & HAVE_HEVC_DEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_hevc_dev);
    } else if ((platform & HAVE_AVSDEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingAVS)) {
        dev = mpp_find_device(mpp_avsd_dev);
    } else if ((platform & HAVE_RKVENC) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingAVC)) {
        dev = mpp_find_device(mpp_rkvenc_dev);
    } else if ((platform & HAVE_VEPU22) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_h265e_dev);
    } else {
        if (type == MPP_CTX_ENC)
            dev = mpp_find_device(mpp_vepu_dev);

        if (dev == NULL)
            dev = mpp_find_device(mpp_vpu_dev);
    }

    return dev;
}